

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update.c
# Opt level: O3

void time_update(void)

{
  int iVar1;
  ROOM_INDEX_DATA *pRVar2;
  int iVar3;
  char *__src;
  int iVar4;
  long lVar5;
  AREA_DATA_conflict *pAVar6;
  char *pcVar7;
  char *pcVar8;
  DESCRIPTOR_DATA *pDVar9;
  bool bVar10;
  char bw3 [4608];
  char bw1 [4608];
  char buf [4608];
  char bw4 [4608];
  char bw2 [4608];
  char colbuf [4608];
  char local_6c38 [4608];
  char local_5a38 [4608];
  char local_4838 [4608];
  char local_3638 [72];
  undefined2 local_35f0;
  char local_2438 [80];
  undefined1 local_23e8;
  char local_1238 [4616];
  
  iVar3 = time_info.season;
  iVar1 = time_info.hour;
  local_4838[0] = '\0';
  builtin_strncpy(local_5a38,"{rA ruddy glow fills the eastern sky as dawn approaches.{x",0x3b);
  __src = local_2438;
  pcVar7 = "{YThe sky brightens as the great flaming disc peers above the eastern horizon.{x";
  pcVar8 = __src;
  for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
    *(undefined8 *)pcVar8 = *(undefined8 *)pcVar7;
    pcVar7 = pcVar7 + 8;
    pcVar8 = pcVar8 + 8;
  }
  local_23e8 = 0;
  builtin_strncpy(local_6c38,"{MThe sun slowly disappears below the western horizon.{x",0x39);
  pcVar7 = "{mThe violet glow leaves the western sky as evening gives way to night.{x";
  pcVar8 = local_3638;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    *(undefined8 *)pcVar8 = *(undefined8 *)pcVar7;
    pcVar7 = pcVar7 + 8;
    pcVar8 = pcVar8 + 8;
  }
  local_35f0 = 0x78;
  if (!time_info.half) {
    time_info.half = true;
    goto LAB_002c0f1c;
  }
  time_info.half = false;
  iVar4 = time_info.hour;
  switch(time_info.season) {
  case 0:
    if (time_info.hour < 0xf) {
      if (time_info.hour == 6) {
LAB_002c0ea7:
        __src = local_5a38;
        sun = 1;
      }
      else {
        iVar4 = time_info.hour + 1;
        if (time_info.hour != 7) break;
LAB_002c0ea1:
        sun = 2;
      }
    }
    else if (time_info.hour == 0xf) {
LAB_002c0e82:
      sun = 3;
      __src = local_6c38;
    }
    else {
      if (time_info.hour != 0x10) goto LAB_002c0e18;
LAB_002c0e55:
      sun = 0;
      __src = local_3638;
    }
    time_info.hour = time_info.hour + 1;
    strcpy(local_4838,__src);
    iVar4 = time_info.hour;
    break;
  case 1:
  case 3:
    if (time_info.hour < 0x11) {
      if (time_info.hour == 5) goto LAB_002c0ea7;
      iVar4 = time_info.hour + 1;
      if (time_info.hour == 6) goto LAB_002c0ea1;
    }
    else {
      if (time_info.hour == 0x11) goto LAB_002c0e82;
      if (time_info.hour == 0x12) goto LAB_002c0e55;
LAB_002c0e18:
      time_info.hour = time_info.hour + 1;
      iVar4 = time_info.hour;
      if (iVar1 == 0x17) {
        time_info.hour = 0;
        time_info.day = time_info.day + 1;
        iVar4 = time_info.hour;
      }
    }
    break;
  case 2:
    if (0x12 < time_info.hour) {
      if (time_info.hour == 0x13) goto LAB_002c0e82;
      if (time_info.hour == 0x14) goto LAB_002c0e55;
      goto LAB_002c0e18;
    }
    if (time_info.hour == 4) goto LAB_002c0ea7;
    iVar4 = time_info.hour + 1;
    if (time_info.hour == 5) goto LAB_002c0ea1;
  }
  time_info.hour = iVar4;
  if (0x1d < time_info.day) {
    time_info.day = 0;
    iVar1 = time_info.month + 1;
    iVar4 = time_info.month * -0x55555555;
    time_info.month = iVar1;
    if (iVar4 + 0x80000000U < 0x55555555) {
      time_info.season = 0;
      if (iVar3 < 3) {
        time_info.season = iVar3 + 1;
      }
    }
  }
  if (0xb < time_info.month) {
    time_info.month = 0;
    time_info.year = time_info.year + 1;
  }
LAB_002c0f1c:
  if (local_4838[0] != '\0') {
    if (descriptor_list == (DESCRIPTOR_DATA *)0x0) {
      bVar10 = false;
    }
    else {
      pDVar9 = descriptor_list;
      do {
        if (pDVar9->connected == 0) {
          pRVar2 = pDVar9->character->in_room;
          if (((((pRVar2 != (ROOM_INDEX_DATA *)0x0) && (pRVar2->sector_type != 8)) &&
               (bVar10 = is_outside(pDVar9->character), bVar10)) &&
              ((bVar10 = is_awake(pDVar9->character), bVar10 &&
               (bVar10 = is_editing(pDVar9->character), !bVar10)))) &&
             ((bVar10 = is_affected_area(pDVar9->character->in_room->area,(int)gsn_whiteout),
              !bVar10 &&
              ((bVar10 = is_affected_area(pDVar9->character->in_room->area,(int)gsn_cyclone),
               !bVar10 && (bVar10 = is_affected_by(pDVar9->character,0), !bVar10)))))) {
            colorconv(local_1238,local_4838,pDVar9->character);
            send_to_char(local_1238,pDVar9->character);
            send_to_char("\n\r",pDVar9->character);
          }
        }
        pDVar9 = pDVar9->next;
      } while (pDVar9 != (DESCRIPTOR_DATA *)0x0);
      bVar10 = local_4838[0] == '\0';
    }
    pAVar6 = area_first;
    if (area_first != (AREA_DATA_conflict *)0x0 && !bVar10) {
      do {
        if ((pAVar6->progtypes[0] & 4) != 0) {
          (*(code *)pAVar6->aprogs->sun_prog)(pAVar6);
        }
        pAVar6 = pAVar6->next;
      } while (pAVar6 != (AREA_DATA_conflict *)0x0);
    }
  }
  return;
}

Assistant:

void time_update(void)
{
	char buf[MSL], colbuf[MSL];
	char bw1[MSL], bw2[MSL], bw3[MSL], bw4[MSL];
	DESCRIPTOR_DATA *d;
	AREA_DATA *area;

	buf[0] = '\0';

	sprintf(bw1, "{rA ruddy glow fills the eastern sky as dawn approaches.{x");
	sprintf(bw2, "{YThe sky brightens as the great flaming disc peers above the eastern horizon.{x");
	sprintf(bw3, "{MThe sun slowly disappears below the western horizon.{x");
	sprintf(bw4, "{mThe violet glow leaves the western sky as evening gives way to night.{x");

	if (time_info.half)
	{
		time_info.half= false;

		/* Season affects sunrise/sunset! */
		switch (time_info.season)
		{
			case 0:
				switch (++time_info.hour)
				{
					case 7:
						sun = SolarPosition::Sunrise;
						sprintf(buf, "%s", bw1);
						break;
					case 8:
						sun = SolarPosition::Daylight;
						sprintf(buf, "%s", bw2);
						break;
					case 16:
						sun = SolarPosition::Sunset;
						sprintf(buf, "%s", bw3);
						break;
					case 17:
						sun = SolarPosition::Dark;
						sprintf(buf, "%s", bw4);
						break;
					case 24:
						time_info.hour = 0;
						time_info.day++;
						break;
				}

				break;
			case 1:
				switch (++time_info.hour)
				{
					case 6:
						sun = SolarPosition::Sunrise;
						sprintf(buf, "%s", bw1);
						break;
					case 7:
						sun = SolarPosition::Daylight;
						sprintf(buf, "%s", bw2);
						break;
					case 18:
						sun = SolarPosition::Sunset;
						sprintf(buf, "%s", bw3);
						break;
					case 19:
						sun = SolarPosition::Dark;
						sprintf(buf, "%s", bw4);
						break;
					case 24:
						time_info.hour = 0;
						time_info.day++;
						break;
				}

				break;
			case (2):
				switch (++time_info.hour)
				{
					case 5:
						sun = SolarPosition::Sunrise;
						sprintf(buf, "%s", bw1);
						break;
					case 6:
						sun = SolarPosition::Daylight;
						sprintf(buf, "%s", bw2);
						break;
					case 20:
						sun = SolarPosition::Sunset;
						sprintf(buf, "%s", bw3);
						break;
					case 21:
						sun = SolarPosition::Dark;
						sprintf(buf, "%s", bw4);
						break;
					case 24:
						time_info.hour = 0;
						time_info.day++;
						break;
				}

				break;
			case 3:
				switch (++time_info.hour)
				{
					case 6:
						sun = SolarPosition::Sunrise;
						sprintf(buf, "%s", bw1);
						break;
					case 7:
						sun = SolarPosition::Daylight;
						sprintf(buf, "%s", bw2);
						break;
					case 18:
						sun = SolarPosition::Sunset;
						sprintf(buf, "%s", bw3);
						break;
					case 19:
						sun = SolarPosition::Dark;
						sprintf(buf, "%s", bw4);
						break;
					case 24:
						time_info.hour = 0;
						time_info.day++;
						break;
				}

				break;
		}

		if (time_info.day >= 30)
		{
			time_info.day = 0;
			time_info.month++;

			if ((time_info.month + 1) % 3 == 0)
			{
				time_info.season++;
				if (time_info.season > 3)
					time_info.season = 0;
			}
		}

		if (time_info.month >= 12)
		{
			time_info.month = 0;
			time_info.year++;
			// update_guild_leader();
		}
	}
	else
	{
		time_info.half = true;
	}

	if (buf[0] != '\0')
	{
		for (d = descriptor_list; d != nullptr; d = d->next)
		{
			if (d->connected == CON_PLAYING
				&& d->character->in_room
				&& d->character->in_room->sector_type != SECT_UNDERWATER
				&& is_outside(d->character)
				&& is_awake(d->character)
				&& !is_editing(d->character)
				&& !(is_affected_area(d->character->in_room->area, gsn_whiteout))
				&& !(is_affected_area(d->character->in_room->area, gsn_cyclone))
				&& !(is_affected_by(d->character, AFF_BLIND)))
			{
				colorconv(colbuf, buf, d->character);
				send_to_char(colbuf, d->character);
				send_to_char("\n\r", d->character);
			}
		}
	}

	if (buf[0] != '\0')
	{
		for (area = area_first; area != nullptr; area = area->next)
		{
			if (IS_SET(area->progtypes, APROG_SUN))
				(area->aprogs->sun_prog)(area);
		}
	}
}